

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::AddGlyph(ImFont *this,ImWchar codepoint,float x0,float y0,float x1,float y1,float u0,
                float v0,float u1,float v1,float advance_x)

{
  value_type *pvVar1;
  ImFontGlyph *glyph;
  float v1_local;
  float u1_local;
  float v0_local;
  float u0_local;
  float y1_local;
  float x1_local;
  float y0_local;
  float x0_local;
  ImWchar codepoint_local;
  ImFont *this_local;
  
  ImVector<ImFontGlyph>::resize(&this->Glyphs,(this->Glyphs).Size + 1);
  pvVar1 = ImVector<ImFontGlyph>::back(&this->Glyphs);
  pvVar1->Codepoint = codepoint;
  pvVar1->X0 = x0;
  pvVar1->Y0 = y0;
  pvVar1->X1 = x1;
  pvVar1->Y1 = y1;
  pvVar1->U0 = u0;
  pvVar1->V0 = v0;
  pvVar1->U1 = u1;
  pvVar1->V1 = v1;
  pvVar1->AdvanceX = advance_x + (this->ConfigData->GlyphExtraSpacing).x;
  if ((this->ConfigData->PixelSnapH & 1U) != 0) {
    pvVar1->AdvanceX = (float)(int)(pvVar1->AdvanceX + 0.5);
  }
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface =
       (int)((pvVar1->U1 - pvVar1->U0) * (float)this->ContainerAtlas->TexWidth + 1.99) *
       (int)((pvVar1->V1 - pvVar1->V0) * (float)this->ContainerAtlas->TexHeight + 1.99) +
       this->MetricsTotalSurface;
  return;
}

Assistant:

void ImFont::AddGlyph(ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (ImWchar)codepoint;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x + ConfigData->GlyphExtraSpacing.x;  // Bake spacing into AdvanceX

    if (ConfigData->PixelSnapH)
        glyph.AdvanceX = (float)(int)(glyph.AdvanceX + 0.5f);

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + 1.99f) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + 1.99f);
}